

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

IntBounds * __thiscall
GlobOpt::GetIntBoundsToUpdate
          (GlobOpt *this,ValueInfo *valueInfo,IntConstantBounds *constantBounds,
          bool isSettingNewBound,bool isBoundConstant,bool isSettingUpperBound,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntBoundedValueInfo *this_00;
  IntBounds *pIVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar5;
  IntBounds *bounds;
  bool isExplicit_local;
  bool isSettingUpperBound_local;
  bool isBoundConstant_local;
  bool isSettingNewBound_local;
  IntConstantBounds *constantBounds_local;
  ValueInfo *valueInfo_local;
  GlobOpt *this_local;
  
  if (valueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x16c,"(valueInfo)","valueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsLikelyInt(&valueInfo->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x16d,"(valueInfo->IsLikelyInt())","valueInfo->IsLikelyInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DoTrackRelativeIntBounds(this);
  if (bVar2) {
    bVar2 = ValueInfo::IsIntBounded(valueInfo);
    if (bVar2) {
      this_00 = ValueInfo::AsIntBounded(valueInfo);
      pIVar4 = IntBoundedValueInfo::Bounds(this_00);
      paVar5 = &ValueInfo::Type(valueInfo)->field_0;
      bVar2 = IntBounds::RequiresIntBoundedValueInfo
                        (pIVar4,(ValueType)
                                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar5->field_0);
      if (bVar2) {
        pIVar4 = IntBounds::Clone(pIVar4);
        return pIVar4;
      }
    }
    bVar2 = ValueType::IsInt(&valueInfo->super_ValueType);
    if (bVar2) {
      bVar2 = IntConstantBounds::IsConstant(constantBounds);
      if (bVar2) {
        this_local = (GlobOpt *)0x0;
      }
      else {
        if (isBoundConstant) {
          if ((!isSettingUpperBound) || (!isExplicit)) {
            return (IntBounds *)0x0;
          }
        }
        else if (!isSettingNewBound) {
          return (IntBounds *)0x0;
        }
        this_local = (GlobOpt *)IntBounds::New(constantBounds,false,this->alloc);
      }
    }
    else {
      this_local = (GlobOpt *)0x0;
    }
  }
  else {
    this_local = (GlobOpt *)0x0;
  }
  return (IntBounds *)this_local;
}

Assistant:

IntBounds *GlobOpt::GetIntBoundsToUpdate(
    const ValueInfo *const valueInfo,
    const IntConstantBounds &constantBounds,
    const bool isSettingNewBound,
    const bool isBoundConstant,
    const bool isSettingUpperBound,
    const bool isExplicit)
{
    Assert(valueInfo);
    Assert(valueInfo->IsLikelyInt());

    if(!DoTrackRelativeIntBounds())
    {
        return nullptr;
    }

    if(valueInfo->IsIntBounded())
    {
        const IntBounds *const bounds = valueInfo->AsIntBounded()->Bounds();
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return bounds->Clone();
        }
    }

    if(valueInfo->IsInt())
    {
        if(constantBounds.IsConstant())
        {
            // Don't start tracking relative bounds for int constant values, just retain existing relative bounds. Will use
            // IntConstantValueInfo instead.
            return nullptr;
        }

        if(isBoundConstant)
        {
            // There are no relative bounds to track
            if(!(isSettingUpperBound && isExplicit))
            {
                // We are not setting a constant upper bound that is established explicitly, will use IntRangeValueInfo instead
                return nullptr;
            }
        }
        else if(!isSettingNewBound)
        {
            // New relative bounds are not being set, will use IntRangeValueInfo instead
            return nullptr;
        }
        return IntBounds::New(constantBounds, false, alloc);
    }

    return nullptr;
}